

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * ImageFromImage(Image *__return_storage_ptr__,Image image,Rectangle rec)

{
  int iVar1;
  void *pvVar2;
  Image *result;
  int local_20;
  int y;
  int bytesPerPixel;
  Rectangle rec_local;
  
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = GetPixelDataSize(1,1,image.format);
  rec_local.x = rec.width;
  __return_storage_ptr__->width = (int)rec_local.x;
  rec_local.y = rec.height;
  __return_storage_ptr__->height = (int)rec_local.y;
  pvVar2 = calloc((long)((int)(rec_local.x * rec_local.y) * iVar1),1);
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->format = image.format;
  __return_storage_ptr__->mipmaps = 1;
  for (local_20 = 0; (float)local_20 < rec_local.y; local_20 = local_20 + 1) {
    bytesPerPixel = (int)rec.y;
    y = (int)rec.x;
    memcpy((void *)((long)__return_storage_ptr__->data + (long)(local_20 * (int)rec_local.x * iVar1)
                   ),
           (void *)((long)image.data +
                   (long)(((local_20 + (int)(float)bytesPerPixel) * image.width + (int)(float)y) *
                         iVar1)),(long)((int)rec_local.x * iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromImage(Image image, Rectangle rec)
{
    Image result = { 0 };

    int bytesPerPixel = GetPixelDataSize(1, 1, image.format);

    // TODO: Check rec is valid?

    result.width = (int)rec.width;
    result.height = (int)rec.height;
    result.data = RL_CALLOC((int)(rec.width*rec.height)*bytesPerPixel, 1);
    result.format = image.format;
    result.mipmaps = 1;

    for (int y = 0; y < rec.height; y++)
    {
        memcpy(((unsigned char *)result.data) + y*(int)rec.width*bytesPerPixel, ((unsigned char *)image.data) + ((y + (int)rec.y)*image.width + (int)rec.x)*bytesPerPixel, (int)rec.width*bytesPerPixel);
    }

    return result;
}